

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O0

void __thiscall
ScriptMemoryDumper::DumpLargeBucket(ScriptMemoryDumper *this,LargeHeapBucket *heapBucket)

{
  LargeHeapBucket *heapBucket_local;
  ScriptMemoryDumper *this_local;
  
  DumpLargeHeapBlockList(this,heapBucket->fullLargeBlockList);
  DumpLargeHeapBlockList(this,heapBucket->largeBlockList);
  DumpLargeHeapBlockList(this,heapBucket->largePageHeapBlockList);
  DumpLargeHeapBlockList(this,heapBucket->pendingDisposeLargeBlockList);
  DumpLargeHeapBlockList(this,heapBucket->pendingSweepLargeBlockList);
  DumpLargeHeapBlockList(this,heapBucket->partialSweptLargeBlockList);
  return;
}

Assistant:

void ScriptMemoryDumper::DumpLargeBucket(LargeHeapBucket* heapBucket)
{
    DumpLargeHeapBlockList(heapBucket->fullLargeBlockList);
    DumpLargeHeapBlockList(heapBucket->largeBlockList);
#ifdef RECYCLER_PAGE_HEAP
    DumpLargeHeapBlockList(heapBucket->largePageHeapBlockList);
#endif
    DumpLargeHeapBlockList(heapBucket->pendingDisposeLargeBlockList);
#if ENABLE_CONCURRENT_GC
    DumpLargeHeapBlockList(heapBucket->pendingSweepLargeBlockList);
#if ENABLE_PARTIAL_GC
    DumpLargeHeapBlockList(heapBucket->partialSweptLargeBlockList);
#endif
#endif
}